

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dct.cc
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  byte bVar3;
  ostream *poVar4;
  reference pvVar5;
  long in_RSI;
  int in_EDI;
  double dVar6;
  ostringstream error_message_9;
  ostringstream error_message_8;
  int i_1;
  int i;
  ostringstream error_message_7;
  vector<double,_std::allocator<double>_> output_y;
  vector<double,_std::allocator<double>_> output_x;
  vector<double,_std::allocator<double>_> input_y;
  vector<double,_std::allocator<double>_> input_x;
  ostringstream error_message_6;
  Buffer buffer;
  DiscreteCosineTransform discrete_cosine_transform;
  istream *input_stream;
  ostringstream error_message_5;
  ifstream ifs;
  ostringstream error_message_4;
  char *input_file;
  ostringstream error_message_3;
  int num_input_files;
  ostringstream error_message_2;
  int tmp_1;
  int max_1;
  int min_1;
  ostringstream error_message_1;
  int tmp;
  int max;
  int min;
  ostringstream error_message;
  int option_char;
  OutputFormats output_format;
  InputFormats input_format;
  int dct_length;
  option *in_stack_ffffffffffffe9f8;
  DiscreteCosineTransform *in_stack_ffffffffffffea00;
  undefined7 in_stack_ffffffffffffea08;
  undefined1 in_stack_ffffffffffffea0f;
  allocator *in_stack_ffffffffffffea10;
  undefined7 in_stack_ffffffffffffea18;
  undefined1 in_stack_ffffffffffffea1f;
  ostream *in_stack_ffffffffffffea20;
  value_type vVar7;
  int *in_stack_ffffffffffffea30;
  istream *in_stack_ffffffffffffea38;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffea40;
  value_type in_stack_ffffffffffffea48;
  value_type in_stack_ffffffffffffea50;
  int *in_stack_ffffffffffffea60;
  allocator *paVar8;
  int in_stack_ffffffffffffea6c;
  DiscreteCosineTransform *in_stack_ffffffffffffea70;
  char *local_1540;
  Buffer *in_stack_ffffffffffffead0;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffead8;
  undefined7 in_stack_ffffffffffffeae0;
  byte in_stack_ffffffffffffeae7;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffeae8;
  undefined4 in_stack_ffffffffffffeaf0;
  _Ios_Openmode in_stack_ffffffffffffeaf4;
  DiscreteCosineTransform *in_stack_ffffffffffffeaf8;
  vector<double,_std::allocator<double>_> *local_14f8;
  byte local_14aa;
  byte local_1462;
  bool local_143a;
  allocator<char> local_1419;
  ostringstream *in_stack_ffffffffffffebe8;
  string *in_stack_ffffffffffffebf0;
  ostringstream local_13f8 [383];
  allocator local_1279;
  string local_1278 [32];
  ostringstream local_1258 [380];
  int local_10dc;
  int local_10d8;
  allocator local_10d1;
  string local_10d0 [32];
  ostringstream local_10b0 [384];
  vector<double,_std::allocator<double>_> local_f30;
  vector<double,_std::allocator<double>_> local_f10 [3];
  allocator local_eb1;
  string local_eb0 [32];
  ostringstream local_e90 [512];
  char *local_c90;
  undefined4 local_c88;
  allocator local_c81;
  string local_c80 [32];
  ostringstream local_c60 [376];
  char local_ae8 [527];
  allocator local_8d9;
  string local_8d8 [32];
  ostringstream local_8b8 [376];
  vector<double,_std::allocator<double>_> *local_740;
  allocator local_731;
  string local_730 [32];
  ostringstream local_710 [376];
  int local_598;
  allocator local_591;
  string local_590 [32];
  ostringstream local_570 [383];
  allocator local_3f1;
  string local_3f0 [32];
  int local_3d0;
  undefined4 local_3cc;
  undefined4 local_3c8;
  allocator local_3c1;
  string local_3c0 [32];
  ostringstream local_3a0 [383];
  allocator local_221;
  string local_220 [32];
  int local_200;
  undefined4 local_1fc;
  undefined4 local_1f8;
  allocator local_1f1;
  string local_1f0 [32];
  ostringstream local_1d0 [399];
  allocator local_41;
  string local_40 [32];
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  long local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  local_14 = 0x100;
  local_18 = 1;
  local_1c = 1;
  local_10 = in_RSI;
  local_8 = in_EDI;
  while (local_20 = ya_getopt_long((int)((ulong)in_stack_ffffffffffffea10 >> 0x20),
                                   (char **)CONCAT17(in_stack_ffffffffffffea0f,
                                                     in_stack_ffffffffffffea08),
                                   (char *)in_stack_ffffffffffffea00,in_stack_ffffffffffffe9f8,
                                   (int *)0x1037d5), pcVar1 = ya_optarg, local_20 != -1) {
    switch(local_20) {
    case 0x68:
      anon_unknown.dwarf_1b34::PrintUsage(in_stack_ffffffffffffea20);
      return 0;
    default:
      anon_unknown.dwarf_1b34::PrintUsage(in_stack_ffffffffffffea20);
      return 1;
    case 0x6c:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_40,pcVar1,&local_41);
      bVar2 = sptk::ConvertStringToInteger
                        ((string *)CONCAT17(in_stack_ffffffffffffea0f,in_stack_ffffffffffffea08),
                         (int *)in_stack_ffffffffffffea00);
      local_143a = !bVar2 || local_14 < 1;
      std::__cxx11::string::~string(local_40);
      std::allocator<char>::~allocator((allocator<char> *)&local_41);
      if (local_143a) {
        std::__cxx11::ostringstream::ostringstream(local_1d0);
        std::operator<<((ostream *)local_1d0,
                        "The argument for the -l option must be a positive integer");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1f0,"dct",&local_1f1);
        sptk::PrintErrorMessage(in_stack_ffffffffffffebf0,in_stack_ffffffffffffebe8);
        std::__cxx11::string::~string(local_1f0);
        std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_1d0);
        return local_4;
      }
      break;
    case 0x6f:
      local_3c8 = 0;
      local_3cc = 4;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_3f0,pcVar1,&local_3f1);
      bVar2 = sptk::ConvertStringToInteger
                        ((string *)CONCAT17(in_stack_ffffffffffffea0f,in_stack_ffffffffffffea08),
                         (int *)in_stack_ffffffffffffea00);
      local_14aa = 1;
      if (bVar2) {
        bVar2 = sptk::IsInRange(local_3d0,0,4);
        local_14aa = bVar2 ^ 0xff;
      }
      std::__cxx11::string::~string(local_3f0);
      std::allocator<char>::~allocator((allocator<char> *)&local_3f1);
      if ((local_14aa & 1) != 0) {
        std::__cxx11::ostringstream::ostringstream(local_570);
        poVar4 = std::operator<<((ostream *)local_570,
                                 "The argument for the -o option must be an integer ");
        poVar4 = std::operator<<(poVar4,"in the range of ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,0);
        poVar4 = std::operator<<(poVar4," to ");
        std::ostream::operator<<(poVar4,4);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_590,"dct",&local_591);
        sptk::PrintErrorMessage(in_stack_ffffffffffffebf0,in_stack_ffffffffffffebe8);
        std::__cxx11::string::~string(local_590);
        std::allocator<char>::~allocator((allocator<char> *)&local_591);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_570);
        return local_4;
      }
      local_1c = local_3d0;
      break;
    case 0x71:
      local_1f8 = 0;
      local_1fc = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_220,pcVar1,&local_221);
      bVar2 = sptk::ConvertStringToInteger
                        ((string *)CONCAT17(in_stack_ffffffffffffea0f,in_stack_ffffffffffffea08),
                         (int *)in_stack_ffffffffffffea00);
      local_1462 = 1;
      if (bVar2) {
        bVar2 = sptk::IsInRange(local_200,0,1);
        local_1462 = bVar2 ^ 0xff;
      }
      std::__cxx11::string::~string(local_220);
      std::allocator<char>::~allocator((allocator<char> *)&local_221);
      if ((local_1462 & 1) != 0) {
        std::__cxx11::ostringstream::ostringstream(local_3a0);
        poVar4 = std::operator<<((ostream *)local_3a0,
                                 "The argument for the -q option must be an integer ");
        poVar4 = std::operator<<(poVar4,"in the range of ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,0);
        poVar4 = std::operator<<(poVar4," to ");
        std::ostream::operator<<(poVar4,1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_3c0,"dct",&local_3c1);
        sptk::PrintErrorMessage(in_stack_ffffffffffffebf0,in_stack_ffffffffffffebe8);
        std::__cxx11::string::~string(local_3c0);
        std::allocator<char>::~allocator((allocator<char> *)&local_3c1);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_3a0);
        return local_4;
      }
      local_18 = local_200;
    }
  }
  local_598 = local_8 - ya_optind;
  if (1 < local_598) {
    std::__cxx11::ostringstream::ostringstream(local_710);
    std::operator<<((ostream *)local_710,"Too many input files");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_730,"dct",&local_731);
    sptk::PrintErrorMessage(in_stack_ffffffffffffebf0,in_stack_ffffffffffffebe8);
    std::__cxx11::string::~string(local_730);
    std::allocator<char>::~allocator((allocator<char> *)&local_731);
    local_4 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_710);
    return local_4;
  }
  if (local_598 == 0) {
    local_14f8 = (vector<double,_std::allocator<double>_> *)0x0;
  }
  else {
    local_14f8 = *(vector<double,_std::allocator<double>_> **)(local_10 + (long)ya_optind * 8);
  }
  local_740 = local_14f8;
  bVar2 = sptk::SetBinaryMode();
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream(local_8b8);
    std::operator<<((ostream *)local_8b8,"Cannot set translation mode");
    paVar8 = &local_8d9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_8d8,"dct",paVar8);
    sptk::PrintErrorMessage(in_stack_ffffffffffffebf0,in_stack_ffffffffffffebe8);
    std::__cxx11::string::~string(local_8d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_8d9);
    local_4 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_8b8);
    return local_4;
  }
  std::ifstream::ifstream(local_ae8);
  if (local_740 != (vector<double,_std::allocator<double>_> *)0x0) {
    in_stack_ffffffffffffeae8 = local_740;
    in_stack_ffffffffffffeaf4 = std::operator|(_S_in,_S_bin);
    std::ifstream::open(local_ae8,(_Ios_Openmode)in_stack_ffffffffffffeae8);
    in_stack_ffffffffffffeae7 = std::ios::fail();
    if ((in_stack_ffffffffffffeae7 & 1) != 0) {
      std::__cxx11::ostringstream::ostringstream(local_c60);
      poVar4 = std::operator<<((ostream *)local_c60,"Cannot open file ");
      std::operator<<(poVar4,(char *)local_740);
      paVar8 = &local_c81;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_c80,"dct",paVar8);
      sptk::PrintErrorMessage(in_stack_ffffffffffffebf0,in_stack_ffffffffffffebe8);
      std::__cxx11::string::~string(local_c80);
      std::allocator<char>::~allocator((allocator<char> *)&local_c81);
      local_4 = 1;
      local_c88 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_c60);
      goto LAB_0010505b;
    }
  }
  bVar3 = std::ifstream::is_open();
  if ((bVar3 & 1) == 0) {
    local_1540 = (char *)&std::cin;
  }
  else {
    local_1540 = local_ae8;
  }
  local_c90 = local_1540;
  sptk::DiscreteCosineTransform::DiscreteCosineTransform
            (in_stack_ffffffffffffea70,in_stack_ffffffffffffea6c);
  sptk::DiscreteCosineTransform::Buffer::Buffer((Buffer *)in_stack_ffffffffffffea00);
  bVar2 = sptk::DiscreteCosineTransform::IsValid((DiscreteCosineTransform *)0x10455c);
  if (bVar2) {
    std::allocator<double>::allocator((allocator<double> *)0x1046ea);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffea20,
               CONCAT17(in_stack_ffffffffffffea1f,in_stack_ffffffffffffea18),
               (allocator_type *)in_stack_ffffffffffffea10);
    std::allocator<double>::~allocator((allocator<double> *)0x104716);
    std::allocator<double>::allocator((allocator<double> *)0x10473b);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffea20,
               CONCAT17(in_stack_ffffffffffffea1f,in_stack_ffffffffffffea18),
               (allocator_type *)in_stack_ffffffffffffea10);
    std::allocator<double>::~allocator((allocator<double> *)0x104767);
    std::allocator<double>::allocator((allocator<double> *)0x10478c);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffea20,
               CONCAT17(in_stack_ffffffffffffea1f,in_stack_ffffffffffffea18),
               (allocator_type *)in_stack_ffffffffffffea10);
    std::allocator<double>::~allocator((allocator<double> *)0x1047b8);
    std::allocator<double>::allocator((allocator<double> *)0x1047da);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffea20,
               CONCAT17(in_stack_ffffffffffffea1f,in_stack_ffffffffffffea18),
               (allocator_type *)in_stack_ffffffffffffea10);
    std::allocator<double>::~allocator((allocator<double> *)0x104803);
    do {
      bVar2 = sptk::ReadStream<double>
                        (SUB81((ulong)in_stack_ffffffffffffea50 >> 0x30,0),
                         SUB84(in_stack_ffffffffffffea50,0),
                         (int)((ulong)in_stack_ffffffffffffea48 >> 0x20),
                         SUB84(in_stack_ffffffffffffea48,0),in_stack_ffffffffffffea40,
                         in_stack_ffffffffffffea38,in_stack_ffffffffffffea60);
      if ((!bVar2) ||
         ((local_18 == 0 &&
          (bVar2 = sptk::ReadStream<double>
                             (SUB81((ulong)in_stack_ffffffffffffea50 >> 0x30,0),
                              SUB84(in_stack_ffffffffffffea50,0),
                              (int)((ulong)in_stack_ffffffffffffea48 >> 0x20),
                              SUB84(in_stack_ffffffffffffea48,0),in_stack_ffffffffffffea40,
                              in_stack_ffffffffffffea38,in_stack_ffffffffffffea60), !bVar2)))) {
        local_4 = 0;
        local_c88 = 1;
        goto LAB_00104fb7;
      }
      bVar2 = sptk::DiscreteCosineTransform::Run
                        (in_stack_ffffffffffffeaf8,
                         (vector<double,_std::allocator<double>_> *)
                         CONCAT44(in_stack_ffffffffffffeaf4,in_stack_ffffffffffffeaf0),
                         in_stack_ffffffffffffeae8,
                         (vector<double,_std::allocator<double>_> *)
                         CONCAT17(in_stack_ffffffffffffeae7,in_stack_ffffffffffffeae0),
                         in_stack_ffffffffffffead8,in_stack_ffffffffffffead0);
      if (!bVar2) {
        std::__cxx11::ostringstream::ostringstream(local_10b0);
        std::operator<<((ostream *)local_10b0,"Failed to run discrete cosine transform");
        paVar8 = &local_10d1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_10d0,"dct",paVar8);
        sptk::PrintErrorMessage(in_stack_ffffffffffffebf0,in_stack_ffffffffffffebe8);
        std::__cxx11::string::~string(local_10d0);
        std::allocator<char>::~allocator((allocator<char> *)&local_10d1);
        local_4 = 1;
        local_c88 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_10b0);
        goto LAB_00104fb7;
      }
      if (local_1c == 3) {
        for (local_10d8 = 0; local_10d8 < local_14; local_10d8 = local_10d8 + 1) {
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                             (local_f10,(long)local_10d8);
          in_stack_ffffffffffffea48 = *pvVar5;
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                             (local_f10,(long)local_10d8);
          in_stack_ffffffffffffea50 = *pvVar5;
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&local_f30,(long)local_10d8);
          in_stack_ffffffffffffea40 = (vector<double,_std::allocator<double>_> *)*pvVar5;
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&local_f30,(long)local_10d8);
          dVar6 = sqrt(in_stack_ffffffffffffea48 * in_stack_ffffffffffffea50 +
                       (double)in_stack_ffffffffffffea40 * *pvVar5);
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                             (local_f10,(long)local_10d8);
          *pvVar5 = dVar6;
        }
      }
      else if (local_1c == 4) {
        for (local_10dc = 0; local_10dc < local_14; local_10dc = local_10dc + 1) {
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                             (local_f10,(long)local_10dc);
          dVar6 = *pvVar5;
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                             (local_f10,(long)local_10dc);
          in_stack_ffffffffffffea30 = (int *)*pvVar5;
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&local_f30,(long)local_10dc);
          vVar7 = *pvVar5;
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&local_f30,(long)local_10dc);
          in_stack_ffffffffffffea38 =
               (istream *)(dVar6 * (double)in_stack_ffffffffffffea30 + vVar7 * *pvVar5);
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                             (local_f10,(long)local_10dc);
          *pvVar5 = (value_type)in_stack_ffffffffffffea38;
        }
      }
      if (((((local_1c == 0) || (local_1c == 1)) || (local_1c == 3)) || (local_1c == 4)) &&
         (bVar2 = sptk::WriteStream<double>
                            (SUB84(in_stack_ffffffffffffea50,0),
                             (int)((ulong)in_stack_ffffffffffffea48 >> 0x20),
                             in_stack_ffffffffffffea40,(ostream *)in_stack_ffffffffffffea38,
                             in_stack_ffffffffffffea30), !bVar2)) {
        std::__cxx11::ostringstream::ostringstream(local_1258);
        std::operator<<((ostream *)local_1258,"Failed to write output sequence");
        in_stack_ffffffffffffea10 = &local_1279;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1278,"dct",in_stack_ffffffffffffea10);
        sptk::PrintErrorMessage(in_stack_ffffffffffffebf0,in_stack_ffffffffffffebe8);
        std::__cxx11::string::~string(local_1278);
        std::allocator<char>::~allocator((allocator<char> *)&local_1279);
        local_4 = 1;
        local_c88 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_1258);
        goto LAB_00104fb7;
      }
    } while (((local_1c != 0) && (local_1c != 2)) ||
            (bVar2 = sptk::WriteStream<double>
                               (SUB84(in_stack_ffffffffffffea50,0),
                                (int)((ulong)in_stack_ffffffffffffea48 >> 0x20),
                                in_stack_ffffffffffffea40,(ostream *)in_stack_ffffffffffffea38,
                                in_stack_ffffffffffffea30), bVar2));
    std::__cxx11::ostringstream::ostringstream(local_13f8);
    std::operator<<((ostream *)local_13f8,"Failed to write imaginary parts");
    in_stack_ffffffffffffea00 = (DiscreteCosineTransform *)&local_1419;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xffffffffffffebe8,"dct",(allocator *)in_stack_ffffffffffffea00);
    sptk::PrintErrorMessage(in_stack_ffffffffffffebf0,in_stack_ffffffffffffebe8);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffebe8);
    std::allocator<char>::~allocator(&local_1419);
    local_4 = 1;
    local_c88 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_13f8);
LAB_00104fb7:
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffea10);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffea10);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffea10);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffea10);
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_e90);
    std::operator<<((ostream *)local_e90,"Failed to initialize DiscreteCosineTransform");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_eb0,"dct",&local_eb1);
    sptk::PrintErrorMessage(in_stack_ffffffffffffebf0,in_stack_ffffffffffffebe8);
    std::__cxx11::string::~string(local_eb0);
    std::allocator<char>::~allocator((allocator<char> *)&local_eb1);
    local_4 = 1;
    local_c88 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_e90);
  }
  sptk::DiscreteCosineTransform::Buffer::~Buffer((Buffer *)in_stack_ffffffffffffea00);
  sptk::DiscreteCosineTransform::~DiscreteCosineTransform(in_stack_ffffffffffffea00);
LAB_0010505b:
  std::ifstream::~ifstream(local_ae8);
  return local_4;
}

Assistant:

int main(int argc, char* argv[]) {
  int dct_length(kDefaultDctLength);
  InputFormats input_format(kDefaultInputFormat);
  OutputFormats output_format(kDefaultOutputFormat);

  for (;;) {
    const int option_char(getopt_long(argc, argv, "l:q:o:h", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'l': {
        if (!sptk::ConvertStringToInteger(optarg, &dct_length) ||
            dct_length <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -l option must be a positive integer";
          sptk::PrintErrorMessage("dct", error_message);
          return 1;
        }
        break;
      }
      case 'q': {
        const int min(0);
        const int max(static_cast<int>(kNumInputFormats) - 1);
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) ||
            !sptk::IsInRange(tmp, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -q option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("dct", error_message);
          return 1;
        }
        input_format = static_cast<InputFormats>(tmp);
        break;
      }
      case 'o': {
        const int min(0);
        const int max(static_cast<int>(kNumOutputFormats) - 1);
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) ||
            !sptk::IsInRange(tmp, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -o option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("dct", error_message);
          return 1;
        }
        output_format = static_cast<OutputFormats>(tmp);
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  const int num_input_files(argc - optind);
  if (1 < num_input_files) {
    std::ostringstream error_message;
    error_message << "Too many input files";
    sptk::PrintErrorMessage("dct", error_message);
    return 1;
  }
  const char* input_file(0 == num_input_files ? NULL : argv[optind]);

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("dct", error_message);
    return 1;
  }

  std::ifstream ifs;
  if (NULL != input_file) {
    ifs.open(input_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file;
      sptk::PrintErrorMessage("dct", error_message);
      return 1;
    }
  }
  std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

  sptk::DiscreteCosineTransform discrete_cosine_transform(dct_length);
  sptk::DiscreteCosineTransform::Buffer buffer;
  if (!discrete_cosine_transform.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to initialize DiscreteCosineTransform";
    sptk::PrintErrorMessage("dct", error_message);
    return 1;
  }

  std::vector<double> input_x(dct_length);
  std::vector<double> input_y(dct_length);
  std::vector<double> output_x(dct_length);
  std::vector<double> output_y(dct_length);

  while (
      sptk::ReadStream(true, 0, 0, dct_length, &input_x, &input_stream, NULL)) {
    if (kInputRealAndImagParts == input_format &&
        !sptk::ReadStream(true, 0, 0, dct_length, &input_y, &input_stream,
                          NULL)) {
      break;
    }

    if (!discrete_cosine_transform.Run(input_x, input_y, &output_x, &output_y,
                                       &buffer)) {
      std::ostringstream error_message;
      error_message << "Failed to run discrete cosine transform";
      sptk::PrintErrorMessage("dct", error_message);
      return 1;
    }

    if (kOutputAmplitude == output_format) {
      for (int i(0); i < dct_length; ++i) {
        output_x[i] =
            std::sqrt(output_x[i] * output_x[i] + output_y[i] * output_y[i]);
      }
    } else if (kOutputPower == output_format) {
      for (int i(0); i < dct_length; ++i) {
        output_x[i] = output_x[i] * output_x[i] + output_y[i] * output_y[i];
      }
    }

    if ((kOutputRealAndImagParts == output_format ||
         kOutputRealPart == output_format ||
         kOutputAmplitude == output_format || kOutputPower == output_format) &&
        !sptk::WriteStream(0, dct_length, output_x, &std::cout, NULL)) {
      std::ostringstream error_message;
      error_message << "Failed to write output sequence";
      sptk::PrintErrorMessage("dct", error_message);
      return 1;
    }

    if ((kOutputRealAndImagParts == output_format ||
         kOutputImagPart == output_format) &&
        !sptk::WriteStream(0, dct_length, output_y, &std::cout, NULL)) {
      std::ostringstream error_message;
      error_message << "Failed to write imaginary parts";
      sptk::PrintErrorMessage("dct", error_message);
      return 1;
    }
  }

  return 0;
}